

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O0

set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> * __thiscall
FIX::SessionSettings::getSessions
          (set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
           *__return_storage_ptr__,SessionSettings *this)

{
  bool bVar1;
  reference __x;
  value_type *setting;
  const_iterator __end1;
  const_iterator __begin1;
  Dictionaries *__range1;
  SessionSettings *this_local;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *result;
  
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
            (__return_storage_ptr__);
  __end1 = std::
           map<FIX::SessionID,_FIX::Dictionary,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
           ::begin(&this->m_settings);
  setting = (value_type *)
            std::
            map<FIX::SessionID,_FIX::Dictionary,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
            ::end(&this->m_settings);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&setting), bVar1) {
    __x = std::_Rb_tree_const_iterator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>::operator*
                    (&__end1);
    std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::insert
              (__return_storage_ptr__,&__x->first);
    std::_Rb_tree_const_iterator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>::operator++
              (&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<SessionID> SessionSettings::getSessions() const {
  std::set<SessionID> result;
  for (const Dictionaries::value_type &setting : m_settings) {
    result.insert(setting.first);
  }
  return result;
}